

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

char * strnstr(char *haystack,char *needle,size_t len)

{
  int iVar1;
  char *pcVar2;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *needleEnd;
  size_t needleLen;
  size_t i;
  size_t local_30;
  ulong local_28;
  char *local_10;
  char *local_8;
  
  pcVar2 = (char *)memchr(in_RSI,0,in_RDX);
  local_8 = in_RDI;
  if (pcVar2 != in_RSI) {
    local_30 = in_RDX;
    if (pcVar2 != (char *)0x0) {
      local_30 = (long)pcVar2 - (long)in_RSI;
    }
    local_10 = in_RDI;
    for (local_28 = 0; local_28 <= in_RDX - local_30; local_28 = local_28 + 1) {
      if ((*local_10 == *in_RSI) && (iVar1 = strncmp(local_10,in_RSI,local_30), iVar1 == 0)) {
        return local_10;
      }
      local_10 = local_10 + 1;
    }
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static char*
strnstr(const char *haystack, const char *needle, size_t len)
{
    size_t i;
    size_t needleLen;
    const char* needleEnd;

    // strnlen is not part of the C standard and does not compile on some platforms, 
    // use case is covered by memchr.
    needleEnd = (char *)memchr(needle, 0, len);
    if (needleEnd == needle)
        return (char *)haystack;

    needleLen = len;
    if (needleEnd != NULL)
        needleLen = needleEnd - needle;

    for (i = 0; i <= len - needleLen; i++)
    {
        if (haystack[0] == needle[0]
            && strncmp(haystack, needle, needleLen) == 0)
            return (char *)haystack;
        haystack++;
    }
    return NULL;
}